

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

void __thiscall
t_haxe_generator::generate_serialize_container
          (t_haxe_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  t_haxe_generator *this_00;
  string *iter_00;
  string iter;
  string counter;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "oprot.writeSetBegin(new TSet(";
      poVar2 = std::operator<<(poVar2,"oprot.writeSetBegin(new TSet(");
      type_to_enum_abi_cxx11_
                (&local_190,(t_haxe_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::operator<<(poVar2,(string *)&local_190);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,".size));");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      goto LAB_001e8e76;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "oprot.writeListBegin(new TList(";
      poVar2 = std::operator<<(poVar2,"oprot.writeListBegin(new TList(");
      type_to_enum_abi_cxx11_
                (&local_190,(t_haxe_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::operator<<(poVar2,(string *)&local_190);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,".length));");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      goto LAB_001e8e76;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_b0,"_key",(allocator *)&local_170);
    t_generator::tmp(&local_190,(t_generator *)this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string((string *)&local_d0,"_sizeCounter",(allocator *)&local_150);
    t_generator::tmp(&local_170,(t_generator *)this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"var ");
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2," : Int = 0;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"for( ");
    poVar2 = std::operator<<(poVar2,(string *)&local_190);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,") {");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"  ");
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,"++;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"}");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar3 = "oprot.writeMapBegin(new TMap(";
    poVar2 = std::operator<<(poVar2,"oprot.writeMapBegin(new TMap(");
    type_to_enum_abi_cxx11_
              (&local_150,(t_haxe_generator *)pcVar3,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar2 = std::operator<<(poVar2,(string *)&local_150);
    this_00 = (t_haxe_generator *)0x2fdaef;
    poVar2 = std::operator<<(poVar2,", ");
    type_to_enum_abi_cxx11_(&local_f0,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,"));");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
LAB_001e8e76:
    std::__cxx11::string::~string((string *)&local_190);
  }
  std::__cxx11::string::string((string *)&local_110,"elem",(allocator *)&local_170);
  t_generator::tmp(&local_190,(t_generator *)this,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"for( ");
      poVar2 = std::operator<<(poVar2,(string *)&local_190);
      poVar2 = std::operator<<(poVar2," in ");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      pcVar3 = ".toArray())";
      goto LAB_001e8fc4;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"for( ");
      poVar2 = std::operator<<(poVar2,(string *)&local_190);
      poVar2 = std::operator<<(poVar2," in ");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      pcVar3 = ")";
      goto LAB_001e8fc4;
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"for( ");
    poVar2 = std::operator<<(poVar2,(string *)&local_190);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    pcVar3 = ".keys())";
LAB_001e8fc4:
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      iter_00 = &local_50;
      std::__cxx11::string::string((string *)iter_00,(string *)&local_190);
      generate_serialize_set_element(this,out,(t_set *)ttype,iter_00);
      goto LAB_001e90a7;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      iter_00 = &local_70;
      std::__cxx11::string::string((string *)iter_00,(string *)&local_190);
      generate_serialize_list_element(this,out,(t_list *)ttype,iter_00);
      goto LAB_001e90a7;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_90,(string *)&local_190);
    std::__cxx11::string::string((string *)&local_130,(string *)prefix);
    iter_00 = &local_90;
    generate_serialize_map_element(this,out,(t_map *)ttype,iter_00,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
LAB_001e90a7:
    std::__cxx11::string::~string((string *)iter_00);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar1 == '\0') goto LAB_001e9135;
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "oprot.writeListEnd();";
    }
    else {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "oprot.writeSetEnd();";
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar3 = "oprot.writeMapEnd();";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
LAB_001e9135:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string((string *)&local_190);
  return;
}

Assistant:

void t_haxe_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  if (ttype->is_map()) {
    string iter = tmp("_key");
    string counter = tmp("_sizeCounter");
    indent(out) << "var " << counter << " : Int = 0;" << endl;
    indent(out) << "for( " << iter << " in " << prefix << ") {" << endl;
    indent(out) << "  " << counter << +"++;" << endl;
    indent(out) << "}" << endl;

    indent(out) << "oprot.writeMapBegin(new TMap(" << type_to_enum(((t_map*)ttype)->get_key_type())
                << ", " << type_to_enum(((t_map*)ttype)->get_val_type()) << ", " << counter << "));"
                << endl;
  } else if (ttype->is_set()) {
    indent(out) << "oprot.writeSetBegin(new TSet(" << type_to_enum(((t_set*)ttype)->get_elem_type())
                << ", " << prefix << ".size));" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "oprot.writeListBegin(new TList("
                << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", " << prefix << ".length));"
                << endl;
  }

  string iter = tmp("elem");
  if (ttype->is_map()) {
    indent(out) << "for( " << iter << " in " << prefix << ".keys())" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "for( " << iter << " in " << prefix << ".toArray())" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "for( " << iter << " in " << prefix << ")" << endl;
  }

  scope_up(out);

  if (ttype->is_map()) {
    generate_serialize_map_element(out, (t_map*)ttype, iter, prefix);
  } else if (ttype->is_set()) {
    generate_serialize_set_element(out, (t_set*)ttype, iter);
  } else if (ttype->is_list()) {
    generate_serialize_list_element(out, (t_list*)ttype, iter);
  }

  scope_down(out);

  if (ttype->is_map()) {
    indent(out) << "oprot.writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "oprot.writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "oprot.writeListEnd();" << endl;
  }

  scope_down(out);
}